

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O1

tnt_iter * tnt_iter_array(tnt_iter *i,char *data,size_t size)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  char *local_30;
  char *tmp_data;
  
  local_30 = data;
  iVar3 = mp_check(&local_30,data + size);
  if (((iVar3 == 0) && (size != 0 && data != (char *)0x0)) &&
     (mp_type_hint[(byte)*data] == MP_ARRAY)) {
    bVar5 = i == (tnt_iter *)0x0;
    if ((bVar5) && (i = (tnt_iter *)tnt_mem_alloc(0xa8), i == (tnt_iter *)0x0)) {
      i = (tnt_iter *)0x0;
    }
    else {
      memset(i,0,0xa8);
      i->alloc = (uint)bVar5;
    }
    if (i != (tnt_iter *)0x0) {
      i->type = TNT_ITER_ARRAY;
      i->next = tnt_iter_array_next;
      i->rewind = tnt_iter_array_rewind;
      i->free = (_func_void_tnt_iter_ptr *)0x0;
      (i->data).array.data = data;
      (i->data).array.first_elem = data;
      bVar1 = *data;
      (i->data).array.first_elem = data + 1;
      if ((bVar1 & 0x40) == 0) {
        uVar4 = bVar1 & 0xf;
      }
      else if ((bVar1 & 1) == 0) {
        uVar2 = *(ushort *)(data + 1);
        (i->data).array.first_elem = data + 3;
        uVar4 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
      }
      else {
        uVar4 = *(uint *)(data + 1);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        (i->data).array.first_elem = data + 5;
      }
      (i->data).array.elem_count = uVar4;
      (i->data).array.cur_index = -1;
      return i;
    }
  }
  return (tnt_iter *)0x0;
}

Assistant:

struct tnt_iter *
tnt_iter_array(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_ARRAY)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_ARRAY;
	i->next = tnt_iter_array_next;
	i->rewind = tnt_iter_array_rewind;
	i->free = NULL;
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->data = data;
	itr->first_elem = data;
	itr->elem_count = mp_decode_array(&itr->first_elem);
	itr->cur_index = -1;
	return i;
}